

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

slist * gen_abs_offset_varpart(compiler_state_t *cstate,bpf_abs_offset *off)

{
  int iVar1;
  slist *s;
  bpf_abs_offset *off_local;
  compiler_state_t *cstate_local;
  
  if (off->is_variable == 0) {
    cstate_local = (compiler_state_t *)0x0;
  }
  else {
    if (off->reg == -1) {
      iVar1 = alloc_reg(cstate);
      off->reg = iVar1;
    }
    cstate_local = (compiler_state_t *)new_stmt(cstate,0x61);
    *(int *)(cstate_local->top_ctx[0].__jmpbuf + 3) = off->reg;
  }
  return (slist *)cstate_local;
}

Assistant:

static struct slist *
gen_abs_offset_varpart(compiler_state_t *cstate, bpf_abs_offset *off)
{
	struct slist *s;

	if (off->is_variable) {
		if (off->reg == -1) {
			/*
			 * We haven't yet assigned a register for the
			 * variable part of the offset of the link-layer
			 * header; allocate one.
			 */
			off->reg = alloc_reg(cstate);
		}

		/*
		 * Load the register containing the variable part of the
		 * offset of the link-layer header into the X register.
		 */
		s = new_stmt(cstate, BPF_LDX|BPF_MEM);
		s->s.k = off->reg;
		return s;
	} else {
		/*
		 * That offset isn't variable, there's no variable part,
		 * so we don't need to generate any code.
		 */
		return NULL;
	}
}